

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result * __thiscall
pugi::xml_document::load_string
          (xml_parse_result *__return_storage_ptr__,xml_document *this,char_t *contents,uint options
          )

{
  size_t size;
  
  size = strlen(contents);
  load_buffer(__return_storage_ptr__,this,contents,size,options,encoding_utf8);
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load_string(const char_t* contents, unsigned int options)
	{
		// Force native encoding (skip autodetection)
	#ifdef PUGIXML_WCHAR_MODE
		xml_encoding encoding = encoding_wchar;
	#else
		xml_encoding encoding = encoding_utf8;
	#endif

		return load_buffer(contents, impl::strlength(contents) * sizeof(char_t), options, encoding);
	}